

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_get_tile_info(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 1;
  }
  puVar3 = (uint *)*puVar5;
  if (puVar3 != (uint *)0x0) {
    if (ctx->frame_worker != (AVxWorker *)0x0) {
      lVar4 = *ctx->frame_worker->data1;
      uVar1 = *(uint *)(lVar4 + 0x9c00);
      uVar2 = *(uint *)(lVar4 + 0x9c04);
      if (*(int *)(lVar4 + 0x9c14) == 0) {
        puVar3[1] = uVar2;
        uVar7 = uVar1;
      }
      else {
        puVar3[1] = 1 << (*(byte *)(lVar4 + 0x9c1c) & 0x1f);
        uVar7 = 1 << (*(byte *)(lVar4 + 0x9c18) & 0x1f);
      }
      *puVar3 = uVar7;
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          puVar3[uVar6 + 2] =
               *(int *)(lVar4 + 40000 + uVar6 * 4) - *(int *)(lVar4 + 0x9c3c + uVar6 * 4);
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if (0 < (int)uVar2) {
        uVar6 = 0;
        do {
          puVar3[uVar6 + 0x42] =
               *(int *)(lVar4 + 0x9d44 + uVar6 * 4) - *(int *)(lVar4 + 0x9d40 + uVar6 * 4);
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      puVar3[0x82] = *(uint *)(lVar4 + 0x5f758);
      return AOM_CODEC_OK;
    }
    return AOM_CODEC_ERROR;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t ctrl_get_tile_info(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  aom_tile_info *const tile_info = va_arg(args, aom_tile_info *);

  if (tile_info) {
    if (ctx->frame_worker) {
      AVxWorker *const worker = ctx->frame_worker;
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1Decoder *pbi = frame_worker_data->pbi;
      const CommonTileParams *tiles = &pbi->common.tiles;

      int tile_rows = tiles->rows;
      int tile_cols = tiles->cols;

      if (tiles->uniform_spacing) {
        tile_info->tile_rows = 1 << tiles->log2_rows;
        tile_info->tile_columns = 1 << tiles->log2_cols;
      } else {
        tile_info->tile_rows = tile_rows;
        tile_info->tile_columns = tile_cols;
      }

      for (int tile_col = 1; tile_col <= tile_cols; tile_col++) {
        tile_info->tile_widths[tile_col - 1] =
            tiles->col_start_sb[tile_col] - tiles->col_start_sb[tile_col - 1];
      }

      for (int tile_row = 1; tile_row <= tile_rows; tile_row++) {
        tile_info->tile_heights[tile_row - 1] =
            tiles->row_start_sb[tile_row] - tiles->row_start_sb[tile_row - 1];
      }
      tile_info->num_tile_groups = pbi->num_tile_groups;
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}